

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

void ts_stack_clear(Stack *self)

{
  Length *pLVar1;
  TSSymbol symbol;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  _func_void_void_ptr_TSLogType_char_ptr *p_Var11;
  SubtreeHeapData *pSVar12;
  undefined4 uVar16;
  size_t sVar13;
  TSRange *pTVar14;
  TSPoint TVar15;
  undefined4 uVar17;
  undefined4 uVar18;
  Length padding;
  Length size;
  Length padding_00;
  Length size_00;
  Lexer *pLVar19;
  uint32_t uVar20;
  Lexer *pLVar21;
  SubtreePool *pool;
  uint32_t uVar22;
  long lVar23;
  ulong uVar24;
  _Bool _Var25;
  _Bool _Var26;
  byte bVar27;
  ushort uVar28;
  TSSymbol TVar29;
  TSStateId TVar30;
  StackVersion SVar31;
  ErrorComparison EVar32;
  StackVersion SVar33;
  uint uVar34;
  StackHead *pSVar35;
  StackEntry *pSVar36;
  Length *pLVar37;
  Subtree SVar38;
  MutableSubtree MVar39;
  undefined8 uVar40;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar41;
  ushort uVar42;
  StackVersion SVar43;
  char *pcVar44;
  uint32_t *puVar45;
  char cVar46;
  int iVar47;
  ulong uVar48;
  ulong uVar49;
  byte bVar50;
  void *unaff_RBX;
  uint32_t uVar51;
  Subtree *pSVar52;
  anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *paVar53;
  TSParser *self_00;
  TSLanguage *pTVar54;
  Stack *pSVar55;
  char *in_R8;
  _func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *unaff_R12;
  _func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *p_Var56;
  _Bool *p_Var57;
  TSRangeArray *pTVar58;
  undefined8 unaff_R14;
  ReusableNode *pRVar59;
  char *pcVar60;
  long lVar61;
  bool bVar62;
  bool bVar63;
  ErrorStatus EVar64;
  Length LVar65;
  Length LVar66;
  Length position;
  Length padding_01;
  Length size_01;
  ErrorStatus b;
  ErrorStatus a;
  uint uStack_1f4;
  ulong uStack_1e0;
  MutableSubtree MStack_1d0;
  uint uStack_1c4;
  Subtree SStack_1c0;
  ReusableNode *pRStack_1b8;
  ulong uStack_1b0;
  Length LStack_1a8;
  int32_t iStack_19c;
  undefined8 uStack_198;
  undefined8 uStack_190;
  ulong uStack_188;
  SubtreeHeapData *pSStack_180;
  uint32_t uStack_174;
  Length *pLStack_170;
  SubtreePool *pSStack_168;
  TableEntry aTStack_160 [2];
  long lStack_138;
  uint32_t uStack_130;
  uint uStack_12c;
  uint uStack_128;
  TableEntry TStack_120;
  ulong uStack_110;
  ulong uStack_108;
  Subtree SStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  MutableSubtree MStack_e0;
  anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *paStack_d8;
  ulong uStack_d0;
  Length *pLStack_c8;
  uint uStack_c0;
  uint uStack_bc;
  TSRangeArray *pTStack_b8;
  ulong uStack_b0;
  Length *pLStack_a8;
  ulong uStack_a0;
  Stack *pSStack_58;
  _func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *p_Stack_50;
  undefined7 extraout_var;
  
  stack_node_retain(self->base_node);
  p_Var56 = unaff_R12;
  if ((self->heads).size != 0) {
    lVar61 = 0;
    p_Var56 = (_func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *)0x0;
    do {
      stack_head_delete((StackHead *)((long)&((self->heads).contents)->node + lVar61),
                        &self->node_pool,self->subtree_pool);
      p_Var56 = p_Var56 + 1;
      lVar61 = lVar61 + 0x28;
    } while (p_Var56 < (_func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *)
                       (ulong)(self->heads).size);
  }
  (self->heads).size = 0;
  if ((self->heads).capacity != 0) goto LAB_0012b31d;
  pSVar35 = (self->heads).contents;
  if (pSVar35 == (StackHead *)0x0) {
LAB_0012b2ff:
    self_00 = (TSParser *)0x8;
    pSVar52 = (Subtree *)0x28;
    pSVar35 = (StackHead *)calloc(8,0x28);
    if (pSVar35 == (StackHead *)0x0) {
      ts_stack_clear_cold_2();
      if (self_00->language == (TSLanguage *)0x0) {
        return;
      }
      if (unaff_R12 == (_func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *)0x0) {
        return;
      }
      *(undefined8 *)&(self_00->lexer).input.encoding = unaff_R14;
      (self_00->lexer).input.payload = unaff_RBX;
      (self_00->lexer).input.read = unaff_R12;
      (self_00->lexer).data.lookahead = 0;
      (self_00->lexer).chunk = (char *)0x0;
      (self_00->lexer).chunk_start = 0;
      (self_00->lexer).chunk_size = 0;
      (self_00->lexer).lookahead_size = 0;
      pTStack_b8 = &self_00->included_range_differences;
      (self_00->included_range_differences).size = 0;
      self_00->included_range_difference_index = 0;
      pSStack_58 = self;
      p_Stack_50 = p_Var56;
      if ((self_00->lexer).current_position.bytes == 0) {
        if ((self_00->stack->heads).size == 0) {
LAB_0012dba1:
          __assert_fail("(uint32_t)version < (&self->heads)->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                        ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
        }
        if (((self_00->stack->heads).contents)->node->state != 1) goto LAB_0012b489;
        if (pSVar52 != (Subtree *)0x0) {
          ts_subtree_retain(*pSVar52);
          self_00->old_tree = *pSVar52;
          in_R8 = (char *)pTStack_b8;
          ts_range_array_get_changed_ranges
                    ((TSRange *)pSVar52[4].ptr,*(uint *)(pSVar52 + 5),
                     (self_00->lexer).included_ranges,(uint)(self_00->lexer).included_range_count,
                     pTStack_b8);
          SVar38 = *pSVar52;
          (self_00->reusable_node).stack.size = 0;
          (self_00->reusable_node).last_external_token.ptr = (SubtreeHeapData *)0x0;
          if ((self_00->reusable_node).stack.capacity == 0) {
            pSVar36 = (self_00->reusable_node).stack.contents;
            if (pSVar36 == (StackEntry *)0x0) {
              lVar61 = 8;
              pSVar36 = (StackEntry *)calloc(8,0x10);
              if (pSVar36 == (StackEntry *)0x0) {
                ts_parser_parse_cold_2();
                if (*(code **)(lVar61 + 0xa0) != (code *)0x0) {
                  (**(code **)(lVar61 + 0xa0))(*(undefined8 *)(lVar61 + 0x98),0,lVar61 + 0xa8);
                }
                if (*(FILE **)(lVar61 + 0x588) == (FILE *)0x0) {
                  return;
                }
                fwrite("graph {\nlabel=\"",0xf,1,*(FILE **)(lVar61 + 0x588));
                pcVar60 = (char *)(lVar61 + 0xa8);
                do {
                  if (*pcVar60 == '\"') {
                    fputc(0x5c,*(FILE **)(lVar61 + 0x588));
                  }
                  else if (*pcVar60 == '\0') {
                    fwrite("\"\n}\n\n",5,1,*(FILE **)(lVar61 + 0x588));
                    return;
                  }
                  fputc((int)*pcVar60,*(FILE **)(lVar61 + 0x588));
                  pcVar60 = pcVar60 + 1;
                } while( true );
              }
            }
            else {
              pSVar36 = (StackEntry *)realloc(pSVar36,0x80);
              if (pSVar36 == (StackEntry *)0x0) {
                ts_parser_parse_cold_1();
                goto LAB_0012b489;
              }
            }
            (self_00->reusable_node).stack.contents = pSVar36;
            (self_00->reusable_node).stack.capacity = 8;
          }
          pSVar36 = (self_00->reusable_node).stack.contents;
          uVar7 = (self_00->reusable_node).stack.size;
          (self_00->reusable_node).stack.size = uVar7 + 1;
          pSVar36[uVar7].tree = SVar38;
          pSVar36 = pSVar36 + uVar7;
          pSVar36->child_index = 0;
          pSVar36->byte_offset = 0;
          if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_00->dot_graph_file != (FILE *)0x0)) {
            builtin_strncpy((self_00->lexer).debug_buffer,"parse_after_edit",0x11);
            ts_parser__log(self_00);
          }
          if ((self_00->included_range_differences).size != 0) {
            lVar61 = 0x14;
            uVar49 = 0;
            do {
              pTVar14 = (self_00->included_range_differences).contents;
              if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                 (self_00->dot_graph_file != (FILE *)0x0)) {
                in_R8 = (char *)(ulong)*(uint *)((long)&(pTVar14->start_point).row + lVar61);
                snprintf((self_00->lexer).debug_buffer,0x400,"different_included_range %u - %u",
                         (ulong)*(uint *)((long)pTVar14 + lVar61 + -4));
                ts_parser__log(self_00);
              }
              uVar49 = uVar49 + 1;
              lVar61 = lVar61 + 0x18;
            } while (uVar49 < (self_00->included_range_differences).size);
          }
          goto LAB_0012b4c7;
        }
        (self_00->reusable_node).stack.size = 0;
        (self_00->reusable_node).last_external_token.ptr = (SubtreeHeapData *)0x0;
        if (((self_00->lexer).logger.log == (_func_void_void_ptr_TSLogType_char_ptr *)0x0) &&
           (self_00->dot_graph_file == (FILE *)0x0)) goto LAB_0012b4c7;
        builtin_strncpy((self_00->lexer).debug_buffer,"new_parse",10);
      }
      else {
LAB_0012b489:
        if (((self_00->lexer).logger.log == (_func_void_void_ptr_TSLogType_char_ptr *)0x0) &&
           (self_00->dot_graph_file == (FILE *)0x0)) goto LAB_0012b4c7;
        builtin_strncpy(pLVar19->debug_buffer,"resume_parsing",0xf);
        pLVar19 = &self_00->lexer;
      }
      ts_parser__log(self_00);
LAB_0012b4c7:
      pLStack_170 = &(self_00->lexer).current_position;
      pcVar60 = (self_00->lexer).debug_buffer;
      pRVar59 = &self_00->reusable_node;
      pLStack_c8 = &(self_00->lexer).token_end_position;
      pLStack_a8 = &(self_00->lexer).token_start_position;
      pSStack_168 = &self_00->tree_pool;
      uStack_110 = 0;
      SStack_100.data = SStack_100.data & 0xffffffff00000000;
      uStack_1b0 = 0;
      pRStack_1b8 = pRVar59;
      do {
        pSVar55 = self_00->stack;
        uVar7 = (pSVar55->heads).size;
        uStack_b0 = (ulong)uVar7;
        if (uVar7 != 0) {
          uStack_1e0 = 0;
          do {
            uStack_c0 = SStack_100._0_4_;
            if (self_00->operation_limit < uStack_110) {
              return;
            }
            if (self_00->enabled != true) {
              return;
            }
            uStack_110 = uStack_110 + 1;
LAB_0012b595:
            pSVar55 = self_00->stack;
            uVar7 = (pSVar55->heads).size;
            if (uVar7 <= uStack_1e0) {
              __assert_fail("(uint32_t)version < (&self->heads)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x2a8,"_Bool ts_stack_is_active(const Stack *, StackVersion)");
            }
            pSVar35 = (pSVar55->heads).contents;
            lStack_138 = uStack_1e0 * 5;
            if (pSVar35[uStack_1e0].status == StackStatusActive) {
              SVar33 = (StackVersion)uStack_1e0;
              if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                 (self_00->dot_graph_file != (FILE *)0x0)) {
                uVar28 = (pSVar35[uStack_1e0].node)->state;
                LVar65 = ts_stack_position(pSVar55,SVar33);
                LVar66 = ts_stack_position(self_00->stack,SVar33);
                in_R8 = (char *)(ulong)uVar7;
                snprintf(pcVar60,0x400,
                         "process version:%d, version_count:%u, state:%d, row:%u, col:%u",
                         uStack_1e0 & 0xffffffff,in_R8,(ulong)uVar28,LVar65._0_8_ >> 0x20,
                         (ulong)LVar66.extent.column);
                ts_parser__log(self_00);
              }
              lVar61 = lStack_138;
              pSVar55 = self_00->stack;
              if (uStack_1e0 < (pSVar55->heads).size) {
                uStack_1f4 = (uint)(&((pSVar55->heads).contents)->node)[lStack_138]->state;
                LVar65 = ts_stack_position(pSVar55,SVar33);
                if ((self_00->stack->heads).size <= uStack_1e0) goto LAB_0012dbc0;
                SStack_100 = (&((self_00->stack->heads).contents)->last_external_token)[lVar61];
                SStack_1c0 = (Subtree)0x0;
                TStack_120.actions._0_4_ = 0;
                TStack_120.actions._4_4_ = 0;
                TStack_120.action_count = 0;
                TStack_120.is_reusable = false;
                TStack_120._13_3_ = 0;
                uVar7 = LVar65.bytes;
                if ((int)uStack_b0 == 1) {
LAB_0012b6bf:
                  uVar51 = (self_00->reusable_node).stack.size;
                  if (uVar51 == 0) {
                    SVar38.ptr = (SubtreeHeapData *)0x0;
                  }
                  else {
                    SVar38 = (Subtree)(pRStack_1b8->stack).contents[uVar51 - 1].tree.ptr;
                  }
                  if (SVar38.ptr == (SubtreeHeapData *)0x0) goto LAB_0012bcbf;
                  if (uVar51 == 0) {
                    uVar51 = 0xffffffff;
                  }
                  else {
                    uVar51 = (pRStack_1b8->stack).contents[uVar51 - 1].byte_offset;
                  }
                  if (((ulong)SVar38.ptr & 1) == 0) {
                    uVar3 = ((Length *)((long)SVar38 + 4))->bytes;
                  }
                  else {
                    uVar3 = SVar38._2_4_ & 0xff;
                  }
                  if (((ulong)SVar38.ptr & 1) == 0) {
                    uVar4 = ((Length *)((long)SVar38 + 0x10))->bytes;
                  }
                  else {
                    uVar4 = SVar38._3_4_ & 0xff;
                  }
                  uVar3 = uVar4 + uVar51 + uVar3;
                  bVar50 = SVar38.data.symbol;
                  if (uVar7 < uVar51) {
                    if (((self_00->lexer).logger.log !=
                         (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                       (self_00->dot_graph_file != (FILE *)0x0)) {
                      if (((ulong)SVar38.ptr & 1) == 0) {
                        uVar28 = (SVar38.ptr)->symbol;
                      }
                      else {
                        uVar28 = (ushort)bVar50;
                      }
                      pcVar44 = "ERROR";
                      if (uVar28 != 0xffff) {
                        if (uVar28 == 0xfffe) {
                          pcVar44 = "_ERROR";
                        }
                        else {
                          pcVar44 = self_00->language->symbol_names[uVar28];
                        }
                      }
                      snprintf(pcVar60,0x400,"before_reusable_node symbol:%s",pcVar44);
                      ts_parser__log(self_00);
                    }
LAB_0012b835:
                    iVar47 = 3;
                  }
                  else {
                    if (uVar51 < uVar7) {
                      if (((self_00->lexer).logger.log !=
                           (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                         (self_00->dot_graph_file != (FILE *)0x0)) {
                        if (((ulong)SVar38.ptr & 1) == 0) {
                          uVar28 = (SVar38.ptr)->symbol;
                        }
                        else {
                          uVar28 = (ushort)bVar50;
                        }
                        pcVar44 = "ERROR";
                        if (uVar28 != 0xffff) {
                          if (uVar28 == 0xfffe) {
                            pcVar44 = "_ERROR";
                          }
                          else {
                            pcVar44 = self_00->language->symbol_names[uVar28];
                          }
                        }
                        snprintf(pcVar60,0x400,"past_reusable_node symbol:%s",pcVar44);
                        ts_parser__log(self_00);
                      }
                      if (uVar7 < uVar3) {
                        _Var25 = reusable_node_descend(pRStack_1b8);
                        iVar47 = 2;
                        if (_Var25) goto LAB_0012b967;
                      }
                    }
                    else {
                      _Var25 = ts_subtree_external_scanner_state_eq
                                         ((self_00->reusable_node).last_external_token,SStack_100);
                      if (_Var25) {
                        if (((ulong)SVar38.ptr & 1) == 0) {
                          uVar4 = *(uint *)&(SVar38.ptr)->field_0x2c >> 5;
                        }
                        else {
                          uVar4 = (uint)((ulong)SVar38.ptr >> 4) & 0xfffffff;
                        }
                        if ((uVar4 & 1) == 0) {
                          if (((ulong)SVar38.ptr & 1) == 0) {
                            if ((SVar38.ptr)->symbol == 0xffff) {
                              bVar62 = false;
                              pcVar44 = "is_error";
                              goto LAB_0012ba36;
                            }
                            uVar4 = *(uint *)&(SVar38.ptr)->field_0x2c >> 7;
                          }
                          else {
                            uVar4 = (uint)((ulong)SVar38.ptr >> 5) & 0x7ffffff;
                          }
                          if ((uVar4 & 1) == 0) {
                            if ((((ulong)SVar38.ptr & 1) == 0) &&
                               (((SVar38.ptr)->field_0x2c & 0x18) != 0)) {
                              bVar62 = false;
                              pcVar44 = "is_fragile";
                            }
                            else {
                              uVar4 = (self_00->included_range_differences).size;
                              uVar8 = self_00->included_range_difference_index;
                              if (uVar8 < uVar4) {
                                lVar61 = (ulong)uVar4 - (ulong)uVar8;
                                puVar45 = &pTStack_b8->contents[uVar8].end_byte;
                                do {
                                  if (uVar51 < *puVar45) {
                                    iVar47 = 2 - (uint)(puVar45[-1] < uVar3);
                                    goto LAB_0012ba08;
                                  }
                                  puVar45 = puVar45 + 6;
                                  lVar61 = lVar61 + -1;
                                } while (lVar61 != 0);
                                iVar47 = 2;
LAB_0012ba08:
                                bVar63 = iVar47 != 2;
                              }
                              else {
                                bVar63 = false;
                              }
                              bVar62 = (bool)(bVar63 ^ 1);
                              pcVar44 = (char *)0x0;
                              if (bVar63) {
                                pcVar44 = "contains_different_included_range";
                              }
                            }
                          }
                          else {
                            bVar62 = false;
                            pcVar44 = "is_missing";
                          }
                        }
                        else {
                          bVar62 = false;
                          pcVar44 = "has_changes";
                        }
LAB_0012ba36:
                        if (bVar62) {
                          if (((ulong)SVar38.ptr & 1) == 0) {
                            if ((SVar38.ptr)->child_count == 0) {
                              uVar3 = (uint)(SVar38.ptr)->symbol;
                            }
                            else {
                              uVar3 = (uint)((SVar38.ptr)->field_17).field_0.first_leaf.symbol;
                            }
                          }
                          else {
                            uVar3 = (uint)bVar50;
                          }
                          uStack_1b0 = CONCAT44(uStack_1b0._4_4_,uVar3);
                          ts_language_table_entry
                                    (self_00->language,(TSStateId)uStack_1f4,(TSSymbol)uVar3,
                                     &TStack_120);
                          _Var25 = ts_parser__can_reuse_first_leaf
                                             (self_00,(TSStateId)uStack_1f4,SVar38,&TStack_120);
                          p_Var11 = (self_00->lexer).logger.log;
                          if (!_Var25) {
                            if ((p_Var11 != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                               (pRVar59 = pRStack_1b8, self_00->dot_graph_file != (FILE *)0x0)) {
                              if (((ulong)SVar38.ptr & 1) == 0) {
                                uVar28 = (SVar38.ptr)->symbol;
                              }
                              else {
                                uVar28 = (ushort)bVar50;
                              }
                              pcVar44 = "ERROR";
                              if (uVar28 != 0xffff) {
                                if (uVar28 == 0xfffe) {
                                  pcVar44 = "_ERROR";
                                }
                                else {
                                  pcVar44 = self_00->language->symbol_names[uVar28];
                                }
                              }
                              in_R8 = "ERROR";
                              if ((TSStateId)uStack_1b0 != -1) {
                                if (uVar3 == 0xfffe) {
                                  in_R8 = "_ERROR";
                                }
                                else {
                                  in_R8 = self_00->language->symbol_names[uVar3];
                                }
                              }
                              snprintf(pcVar60,0x400,
                                       "cant_reuse_node symbol:%s, first_leaf_symbol:%s",pcVar44);
                              ts_parser__log(self_00);
                              pRVar59 = pRStack_1b8;
                            }
                            do {
                              _Var25 = reusable_node_descend(pRVar59);
                            } while (_Var25);
                            reusable_node_advance(pRVar59);
                            goto LAB_0012b835;
                          }
                          if ((p_Var11 != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                             (self_00->dot_graph_file != (FILE *)0x0)) {
                            if (((ulong)SVar38.ptr & 1) == 0) {
                              uVar28 = (SVar38.ptr)->symbol;
                            }
                            else {
                              uVar28 = (ushort)bVar50;
                            }
                            pcVar44 = "ERROR";
                            if (uVar28 != 0xffff) {
                              if (uVar28 == 0xfffe) {
                                pcVar44 = "_ERROR";
                              }
                              else {
                                pcVar44 = self_00->language->symbol_names[uVar28];
                              }
                            }
                            snprintf(pcVar60,0x400,"reuse_node symbol:%s",pcVar44);
                            ts_parser__log(self_00);
                          }
                          ts_subtree_retain(SVar38);
                          iVar47 = 1;
                          MStack_1d0.data = SVar38.data;
                        }
                        else {
                          if (((self_00->lexer).logger.log !=
                               (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                             (self_00->dot_graph_file != (FILE *)0x0)) {
                            if (((ulong)SVar38.ptr & 1) == 0) {
                              uVar28 = (SVar38.ptr)->symbol;
                            }
                            else {
                              uVar28 = (ushort)bVar50;
                            }
                            in_R8 = "ERROR";
                            if (uVar28 != 0xffff) {
                              if (uVar28 == 0xfffe) {
                                in_R8 = "_ERROR";
                              }
                              else {
                                in_R8 = self_00->language->symbol_names[uVar28];
                              }
                            }
                            snprintf(pcVar60,0x400,"cant_reuse_node_%s tree:%s",pcVar44);
                            ts_parser__log(self_00);
                          }
                          pRVar59 = pRStack_1b8;
                          _Var25 = reusable_node_descend(pRStack_1b8);
                          iVar47 = 2;
                          if (_Var25) goto LAB_0012b967;
                          reusable_node_advance(pRVar59);
                          ts_parser__breakdown_top_of_stack(self_00,SVar33);
                          if ((self_00->stack->heads).size <= uStack_1e0) goto LAB_0012dba1;
                          uStack_1f4 = (uint)(&((self_00->stack->heads).contents)->node)[lStack_138]
                                             ->state;
                        }
                        goto LAB_0012b967;
                      }
                      if (((self_00->lexer).logger.log !=
                           (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                         (self_00->dot_graph_file != (FILE *)0x0)) {
                        if (((ulong)SVar38.ptr & 1) == 0) {
                          uVar28 = (SVar38.ptr)->symbol;
                        }
                        else {
                          uVar28 = (ushort)bVar50;
                        }
                        pcVar44 = "ERROR";
                        if (uVar28 != 0xffff) {
                          if (uVar28 == 0xfffe) {
                            pcVar44 = "_ERROR";
                          }
                          else {
                            pcVar44 = self_00->language->symbol_names[uVar28];
                          }
                        }
                        snprintf(pcVar60,0x400,
                                 "reusable_node_has_different_external_scanner_state symbol:%s",
                                 pcVar44);
                        ts_parser__log(self_00);
                      }
                    }
                    reusable_node_advance(pRStack_1b8);
                    iVar47 = 2;
                  }
LAB_0012b967:
                  if (iVar47 != 2) goto LAB_0012bcba;
                  goto LAB_0012b6bf;
                }
                goto LAB_0012bcd2;
              }
              goto LAB_0012dba1;
            }
            uVar49 = (ulong)uStack_c0;
LAB_0012cf09:
            SStack_100._0_4_ = (int)uVar49;
            uStack_1e0 = uStack_1e0 + 1;
            pSVar55 = self_00->stack;
            uVar7 = (pSVar55->heads).size;
            uStack_b0 = (ulong)uVar7;
            if (uStack_b0 <= uStack_1e0) {
              bVar62 = uVar7 == 0;
              goto LAB_0012cf47;
            }
          } while( true );
        }
        bVar62 = true;
LAB_0012cf47:
        iStack_19c = CONCAT31(iStack_19c._1_3_,bVar62);
        lVar61 = 0;
        if (bVar62 == false) {
          uStack_198 = CONCAT44(uStack_198._4_4_,0xffffffff);
          do {
            SVar33 = (StackVersion)lVar61;
            if ((pSVar55->heads).contents[lVar61].status == StackStatusHalted) {
              ts_stack_remove_version(pSVar55,SVar33);
            }
            else {
              EVar64 = ts_parser__version_status(self_00,SVar33);
              uVar49 = EVar64._8_8_;
              uVar40 = EVar64._0_8_;
              uVar7 = EVar64.cost;
              if ((uint)uStack_198 < EVar64.cost) {
                uVar7 = (uint)uStack_198;
              }
              uVar3 = (uint)uStack_198;
              if ((uVar49 >> 0x20 & 1) == 0) {
                uVar3 = uVar7;
              }
              uStack_198 = CONCAT44(uStack_198._4_4_,uVar3);
              if (SVar33 != 0) {
                EVar64 = ts_parser__version_status(self_00,0);
                b._8_8_ = in_R8;
                b.cost = (int)uVar49;
                b.node_count = (int)(uVar49 >> 0x20);
                a.dynamic_precedence = (int)uVar40;
                a.is_in_error = (_Bool)(char)((ulong)uVar40 >> 0x20);
                a._13_3_ = (int3)((ulong)uVar40 >> 0x28);
                a.cost = (int)EVar64._8_8_;
                a.node_count = (int)((ulong)EVar64._8_8_ >> 0x20);
                EVar32 = ts_parser__compare_versions(EVar64._0_8_,a,b);
                (*(code *)(&DAT_001a45f0 + *(int *)(&DAT_001a45f0 + (ulong)EVar32 * 4)))();
                return;
              }
              lVar61 = 1;
            }
            pSVar55 = self_00->stack;
            pRVar59 = pRStack_1b8;
          } while ((uint)lVar61 < (pSVar55->heads).size);
        }
        else {
          uStack_198 = CONCAT44(uStack_198._4_4_,0xffffffff);
        }
        bVar62 = false;
        pSVar55 = self_00->stack;
        uVar7 = (pSVar55->heads).size;
        if (6 < uVar7) {
          do {
            ts_stack_remove_version(pSVar55,6);
            pSVar55 = self_00->stack;
            uVar7 = (pSVar55->heads).size;
          } while (6 < uVar7);
          bVar62 = true;
        }
        if (uVar7 != 0) {
          MVar39.ptr = (SubtreeHeapData *)0x0;
          bVar63 = false;
          do {
            pSVar55 = self_00->stack;
            uVar3 = MVar39._0_4_;
            if ((pSVar55->heads).size <= uVar3) {
              __assert_fail("(uint32_t)version < (&self->heads)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x2b0,"_Bool ts_stack_is_paused(const Stack *, StackVersion)");
            }
            if ((pSVar55->heads).contents[(long)MVar39].status == StackStatusPaused) {
              if ((bVar63) || (5 < self_00->accept_count)) {
                ts_stack_remove_version(pSVar55,uVar3);
                uVar3 = uVar3 - 1;
                uVar7 = uVar7 - 1;
              }
              else {
                if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0)
                   || (self_00->dot_graph_file != (FILE *)0x0)) {
                  snprintf(pcVar60,0x400,"resume version:%u");
                  ts_parser__log(self_00);
                }
                uVar4 = ts_stack_error_cost(self_00->stack,uVar3);
                uStack_198 = CONCAT44(uStack_198._4_4_,uVar4);
                TVar29 = ts_stack_resume(self_00->stack,uVar3);
                uVar4 = (self_00->stack->heads).size;
                ts_parser__do_all_potential_reductions(self_00,uVar3,0);
                uVar8 = (self_00->stack->heads).size;
                LVar65 = ts_stack_position(self_00->stack,uVar3);
                lStack_138 = LVar65._0_8_;
                uStack_188 = CONCAT44(uStack_188._4_4_,LVar65.extent.column);
                if (uVar3 < uVar8) {
                  MStack_e0.data = MStack_e0.data & 0xffffffff00000000;
                  uStack_e8 = CONCAT44(uStack_e8._4_4_,uVar3);
                  uStack_f0 = CONCAT44(uStack_f0._4_4_,uVar4);
                  uStack_f8 = CONCAT44(uStack_f8._4_4_,uVar8);
                  MStack_1d0 = MVar39;
                  do {
                    uVar3 = MStack_1d0._0_4_;
                    if (((ulong)MStack_e0.ptr & 1) == 0) {
                      if ((self_00->stack->heads).size <= uVar3) goto LAB_0012dba1;
                      pTVar54 = self_00->language;
                      if (1 < pTVar54->token_count) {
                        uVar28 = 1;
                        pSStack_180 = (SubtreeHeapData *)
                                      CONCAT44(pSStack_180._4_4_,
                                               (uint)((self_00->stack->heads).contents
                                                      [(long)MStack_1d0].node)->state);
                        do {
                          if ((uVar28 < 0xfffe) &&
                             (ts_language_table_entry
                                        (pTVar54,(TSStateId)pSStack_180,uVar28,aTStack_160),
                             aTStack_160[0].action_count != 0)) {
                            TVar30 = *(TSStateId *)
                                      (CONCAT44(aTStack_160[0].actions._4_4_,
                                                (uint32_t)aTStack_160[0].actions) +
                                      (ulong)(aTStack_160[0].action_count - 1) * 8);
                            bVar50 = *(byte *)(CONCAT44(aTStack_160[0].actions._4_4_,
                                                        (uint32_t)aTStack_160[0].actions) + 6 +
                                              (ulong)(aTStack_160[0].action_count - 1) * 8);
                            if (((bVar50 & 0xf) != 0) && ((bVar50 & 0xf) != 3)) goto LAB_0012d2da;
                          }
                          else {
LAB_0012d2da:
                            TVar30 = 0;
                          }
                          if (TVar30 == 0) {
                            iVar47 = 6;
                          }
                          else {
                            ts_language_table_entry(self_00->language,TVar30,TVar29,aTStack_160);
                            lVar61 = lStack_138;
                            if ((aTStack_160[0].action_count == 0) ||
                               ((*(byte *)(CONCAT44(aTStack_160[0].actions._4_4_,
                                                    (uint32_t)aTStack_160[0].actions) + 6) & 0xf) !=
                                1)) {
                              iVar47 = 0;
                            }
                            else {
                              uVar51 = (uint32_t)lStack_138;
                              if (pLStack_170->bytes != uVar51) {
                                position.extent.column = (uint32_t)uStack_188;
                                position.bytes = (undefined4)lStack_138;
                                position.extent.row = lStack_138._4_4_;
                                ts_lexer_goto(&self_00->lexer,position);
                              }
                              lVar23 = lStack_138;
                              sVar13 = (self_00->lexer).current_included_range_index;
                              if ((sVar13 == 0) ||
                                 (pTVar14 = (self_00->lexer).included_ranges,
                                 pLStack_170->bytes != pTVar14[sVar13].start_byte)) {
                                (pLStack_c8->extent).column = (pLStack_170->extent).column;
                                uVar20 = (pLStack_170->extent).row;
                                pLStack_c8->bytes = pLStack_170->bytes;
                                (pLStack_c8->extent).row = uVar20;
                              }
                              else {
                                TVar15 = pTVar14[sVar13 - 1].end_point;
                                (self_00->lexer).token_end_position.bytes =
                                     pTVar14[sVar13 - 1].end_byte;
                                (self_00->lexer).token_end_position.extent = TVar15;
                              }
                              uVar9 = (self_00->lexer).token_end_position.bytes;
                              uVar17 = (self_00->lexer).token_end_position.extent.row;
                              TStack_120.action_count =
                                   (self_00->lexer).token_end_position.extent.column;
                              LStack_1a8.extent.column = (uint32_t)uStack_188;
                              lStack_138._0_4_ = (undefined4)lVar61;
                              lStack_138._4_4_ = SUB84(lVar61,4);
                              LStack_1a8.bytes = (undefined4)lStack_138;
                              LStack_1a8.extent.row = lStack_138._4_4_;
                              aTStack_160[0].actions._0_4_ = uVar9 - uVar51;
                              uVar4 = (uint)((ulong)lVar61 >> 0x20);
                              paStack_d8 = (anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)
                                           CONCAT44(paStack_d8._4_4_,(uint)TVar29);
                              if (uVar4 < (uint)uVar17) {
                                uVar49 = CONCAT44(TStack_120.action_count,uVar17 - uVar4);
                              }
                              else {
                                uVar49 = CONCAT44(TStack_120.action_count,uVar17) -
                                         ((ulong)LStack_1a8.extent & 0xffffffff00000000) &
                                         0xffffffff00000000;
                              }
                              aTStack_160[0].actions._4_4_ = (undefined4)uVar49;
                              aTStack_160[0].action_count = (uint32_t)(uVar49 >> 0x20);
                              padding_00.extent.row = aTStack_160[0].actions._4_4_;
                              padding_00.bytes = (uint32_t)aTStack_160[0].actions;
                              padding_00.extent.column = aTStack_160[0].action_count;
                              lStack_138 = lVar23;
                              TStack_120.actions._0_4_ = uVar9;
                              TStack_120.actions._4_4_ = uVar17;
                              SVar33 = ts_stack_copy_version(self_00->stack,uVar3);
                              uStack_190 = (ulong)uVar28;
                              SVar38 = ts_subtree_new_missing_leaf
                                                 (pSStack_168,uVar28,padding_00,self_00->language);
                              iVar47 = 0;
                              ts_stack_push(self_00->stack,SVar33,SVar38,false,TVar30);
                              _Var25 = ts_parser__do_all_potential_reductions
                                                 (self_00,SVar33,(TSSymbol)paStack_d8);
                              pRVar59 = pRStack_1b8;
                              if (_Var25) {
                                if (((self_00->lexer).logger.log !=
                                     (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                                   (uVar41 = extraout_var_00, self_00->dot_graph_file != (FILE *)0x0
                                   )) {
                                  if ((self_00->stack->heads).size <= SVar33) goto LAB_0012dba1;
                                  snprintf(pcVar60,0x400,"recover_with_missing symbol:%s, state:%u")
                                  ;
                                  ts_parser__log(self_00);
                                  uVar41 = extraout_var_01;
                                }
                                MStack_e0._0_4_ = (int)CONCAT71(uVar41,1);
                                iVar47 = 4;
                              }
                            }
                          }
                          if ((iVar47 != 6) && (iVar47 != 0)) break;
                          uVar28 = uVar28 + 1;
                          pTVar54 = self_00->language;
                        } while ((uint)uVar28 < pTVar54->token_count);
                      }
                    }
                    in_R8 = (char *)0x0;
                    ts_stack_push(self_00->stack,uVar3,(Subtree)0x0,false,0);
                    MVar39.ptr = (SubtreeHeapData *)(uStack_e8 & 0xffffffff);
                    uVar34 = uVar3 + 1;
                    if (uVar3 == (uint)uStack_e8) {
                      uVar34 = (uint)uStack_f0;
                    }
                    MStack_1d0._4_4_ = 0;
                    MStack_1d0._0_4_ = uVar34;
                    uVar4 = (uint)uStack_f0;
                    uVar8 = (uint)uStack_f8;
                  } while (uVar34 < (uint)uStack_f8);
                }
                uVar3 = MVar39._0_4_;
                if (uVar4 < uVar8) {
                  do {
                    _Var25 = ts_stack_merge(self_00->stack,uVar3,uVar4);
                    if (!_Var25) {
                      __assert_fail("ts_stack_merge(self->stack, version, previous_version_count)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                                    ,0x3c8,
                                    "void ts_parser__handle_error(TSParser *, StackVersion, TSSymbol)"
                                   );
                    }
                    uVar8 = uVar8 - 1;
                  } while (uVar4 != uVar8);
                }
                ts_stack_record_summary(self_00->stack,uVar3,0x10);
                if (self_00->dot_graph_file != (FILE *)0x0) {
                  ts_stack_print_dot_graph(self_00->stack,self_00->language,self_00->dot_graph_file)
                  ;
                  fputs("\n\n",(FILE *)self_00->dot_graph_file);
                }
                bVar63 = true;
              }
            }
            else {
              bVar63 = true;
            }
            MVar39._0_4_ = uVar3 + 1;
            MVar39._4_4_ = 0;
          } while (MVar39._0_4_ < uVar7);
        }
        bVar50 = (byte)iStack_19c;
        if (bVar62) {
          if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_00->dot_graph_file != (FILE *)0x0)) {
            builtin_strncpy(pcVar60,"condense",9);
            ts_parser__log(self_00);
          }
          if (self_00->dot_graph_file != (FILE *)0x0) {
            ts_stack_print_dot_graph(self_00->stack,self_00->language,self_00->dot_graph_file);
            fputs("\n\n",(FILE *)self_00->dot_graph_file);
          }
        }
        pSVar12 = (self_00->finished_tree).ptr;
        if (pSVar12 == (SubtreeHeapData *)0x0) {
LAB_0012d721:
          if ((self_00->halt_on_error == true) && ((uint)uStack_198 != 0)) {
            if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
               (self_00->dot_graph_file != (FILE *)0x0)) {
              builtin_strncpy(pcVar60,"halting_parse",0xe);
              ts_parser__log(self_00);
            }
            if (self_00->dot_graph_file != (FILE *)0x0) {
              ts_stack_print_dot_graph(self_00->stack,self_00->language,self_00->dot_graph_file);
              fputs("\n\n",(FILE *)self_00->dot_graph_file);
            }
            while ((self_00->lexer).data.lookahead != 0) {
              ts_lexer__advance((TSLexer *)self_00,false);
            }
            LStack_1a8 = ts_stack_position(self_00->stack,0);
            pool = pSStack_168;
            uVar10 = (self_00->lexer).current_position.bytes;
            uVar18 = (self_00->lexer).current_position.extent.row;
            TStack_120.action_count = (self_00->lexer).current_position.extent.column;
            aTStack_160[0].actions._0_4_ = uVar10 - LStack_1a8.bytes;
            if (LStack_1a8.extent.row < (uint)uVar18) {
              uVar49 = CONCAT44(TStack_120.action_count,uVar18 - LStack_1a8.extent.row);
            }
            else {
              uVar49 = CONCAT44(TStack_120.action_count,uVar18) -
                       ((ulong)LStack_1a8.extent & 0xffffffff00000000) & 0xffffffff00000000;
            }
            aTStack_160[0].actions._4_4_ = (undefined4)uVar49;
            aTStack_160[0].action_count = (uint32_t)(uVar49 >> 0x20);
            size_00.extent.row = aTStack_160[0].actions._4_4_;
            size_00.bytes = (uint32_t)aTStack_160[0].actions;
            size_00.extent.column = aTStack_160[0].action_count;
            TStack_120.actions._0_4_ = uVar10;
            TStack_120.actions._4_4_ = uVar18;
            SVar38 = ts_subtree_new_leaf(pSStack_168,0xffff,(Length)ZEXT812(0),size_00,
                                         (uint32_t)aTStack_160[0].actions,0,false,false,
                                         self_00->language);
            ((SVar38.ptr)->field_17).lookahead_char = 0;
            *(ushort *)&(SVar38.ptr)->field_0x2c =
                 (ushort)*(undefined4 *)&(SVar38.ptr)->field_0x2c & 0xfffe | 0x18;
            ts_stack_push(self_00->stack,0,SVar38,false,0);
            aTStack_160[0].actions._0_4_ = 0;
            aTStack_160[0].actions._4_4_ = 0;
            aTStack_160[0].action_count = 0;
            aTStack_160[0].is_reusable = false;
            aTStack_160[0]._13_3_ = 0;
            MVar39 = ts_subtree_new_node(pool,0xffff,(SubtreeArray *)aTStack_160,0,self_00->language
                                        );
            (MVar39.ptr)->field_0x2c = (MVar39.ptr)->field_0x2c & 0xfb;
            ts_stack_push(self_00->stack,0,(Subtree)MVar39,false,0);
            in_R8 = (char *)0x0;
            SVar38 = ts_subtree_new_leaf(pool,0,(Length)ZEXT812(0),(Length)ZEXT812(0),0,0,false,
                                         false,self_00->language);
            ts_parser__accept(self_00,0,SVar38);
            bVar27 = 1;
            bVar50 = (byte)iStack_19c;
          }
          else {
            uVar7 = (self_00->included_range_differences).size;
            uVar3 = self_00->included_range_difference_index;
            if (uVar3 < uVar7) {
              puVar45 = &pTStack_b8->contents[uVar3].end_byte;
              do {
                uVar3 = uVar3 + 1;
                if ((uint)uStack_1b0 < *puVar45) break;
                self_00->included_range_difference_index = uVar3;
                puVar45 = puVar45 + 6;
              } while (uVar3 != uVar7);
            }
            bVar27 = 0;
          }
        }
        else {
          if (((ulong)pSVar12 & 1) == 0) {
            uVar7 = *(uint *)&pSVar12->field_0x2c >> 7;
          }
          else {
            uVar7 = (uint)((ulong)pSVar12 >> 5) & 0x7ffffff;
          }
          uVar7 = uVar7 & 1;
          cVar46 = (char)uVar7;
          if (uVar7 != 0) {
            uVar7 = 0x262;
          }
          if (cVar46 == '\0' && ((ulong)pSVar12 & 1) == 0) {
            uVar7 = pSVar12->error_cost;
          }
          bVar27 = 1;
          if ((uint)uStack_198 <= uVar7) goto LAB_0012d721;
        }
        if ((bVar50 | bVar27) == 1) {
          ts_subtree_balance(self_00->finished_tree,pSStack_168,self_00->language);
          if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_00->dot_graph_file != (FILE *)0x0)) {
            builtin_strncpy(pLVar21->debug_buffer,"done",5);
            pLVar21 = &self_00->lexer;
            ts_parser__log(self_00);
          }
          if (self_00->dot_graph_file != (FILE *)0x0) {
            ts_subtree_print_dot_graph
                      (self_00->finished_tree,self_00->language,self_00->dot_graph_file);
            fputs("\n",(FILE *)self_00->dot_graph_file);
          }
          ts_tree_new(self_00->finished_tree,self_00->language,(self_00->lexer).included_ranges,
                      (uint)(self_00->lexer).included_range_count);
          (self_00->finished_tree).ptr = (SubtreeHeapData *)0x0;
          ts_parser_reset(self_00);
          return;
        }
      } while( true );
    }
  }
  else {
    pSVar35 = (StackHead *)realloc(pSVar35,0x140);
    if (pSVar35 == (StackHead *)0x0) {
      ts_stack_clear_cold_1();
      goto LAB_0012b2ff;
    }
  }
  (self->heads).contents = pSVar35;
  (self->heads).capacity = 8;
LAB_0012b31d:
  pSVar35 = (self->heads).contents;
  uVar7 = (self->heads).size;
  (self->heads).size = uVar7 + 1;
  pSVar35[uVar7].node = self->base_node;
  pSVar35[uVar7].status = StackStatusActive;
  pSVar35[uVar7].last_external_token.ptr = (SubtreeHeapData *)0x0;
  (&pSVar35[uVar7].last_external_token)[1].ptr = (SubtreeHeapData *)0x0;
  *(undefined8 *)((long)&pSVar35[uVar7].summary + 6) = 0;
  return;
LAB_0012cd6f:
  ts_stack_renumber_version(self_00->stack,(StackVersion)pSStack_180,SVar33);
  if (self_00->dot_graph_file != (FILE *)0x0) {
    ts_stack_print_dot_graph(self_00->stack,self_00->language,self_00->dot_graph_file);
    fputs("\n\n",(FILE *)self_00->dot_graph_file);
  }
  if ((self_00->stack->heads).size <= uStack_1e0) goto LAB_0012dba1;
  if (((ulong)SStack_1c0 & 1) == 0) {
    if (*(uint32_t *)((long)SStack_1c0 + 0x24) == 0) {
      TVar29 = *(TSSymbol *)((long)SStack_1c0 + 0x28);
    }
    else {
      TVar29 = (((anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)((long)SStack_1c0 + 0x30))->
               field_0).first_leaf.symbol;
    }
  }
  else {
    TVar29 = (TSSymbol)SStack_1c0._1_1_;
  }
  uVar28 = (&((self_00->stack->heads).contents)->node)[lStack_138]->state;
  pTVar54 = self_00->language;
  uStack_1f4 = (uint)uVar28;
  uVar49 = (ulong)uVar28;
  goto LAB_0012c75d;
LAB_0012bcba:
  pRVar59 = pRStack_1b8;
  SStack_1c0.data = MStack_1d0.data;
  if (iVar47 == 3) {
LAB_0012bcbf:
    SStack_1c0 = (Subtree)0x0;
    pRVar59 = pRStack_1b8;
  }
LAB_0012bcd2:
  MStack_e0.data = SStack_1c0.data;
  if (SStack_1c0 == (Subtree)0x0) {
    pSVar12 = (self_00->token_cache).token.ptr;
    if (((pSVar12 != (SubtreeHeapData *)0x0) && ((self_00->token_cache).byte_index == uVar7)) &&
       (_Var25 = ts_subtree_external_scanner_state_eq
                           ((self_00->token_cache).last_external_token,SStack_100), _Var25)) {
      if (((ulong)pSVar12 & 1) == 0) {
        TVar29 = pSVar12->symbol;
      }
      else {
        TVar29 = (TSSymbol)(byte)((ulong)pSVar12 >> 8);
      }
      ts_language_table_entry(self_00->language,(TSStateId)uStack_1f4,TVar29,&TStack_120);
      SVar38 = (self_00->token_cache).token;
      _Var25 = ts_parser__can_reuse_first_leaf(self_00,(TSStateId)uStack_1f4,SVar38,&TStack_120);
      if (_Var25) {
        ts_subtree_retain(SVar38);
        SStack_1c0 = (Subtree)(self_00->token_cache).token.ptr;
        goto LAB_0012bd77;
      }
    }
    SStack_1c0 = (Subtree)0x0;
  }
LAB_0012bd77:
  if (SStack_1c0 != (Subtree)0x0) goto LAB_0012c76a;
  LVar66 = ts_stack_position(self_00->stack,SVar33);
  if (uStack_1e0 < (self_00->stack->heads).size) {
    pTVar54 = self_00->language;
    uStack_d0 = (ulong)(TSStateId)uStack_1f4;
    uVar28 = pTVar54->lex_modes[uStack_d0].external_lex_state;
    uVar7 = CONCAT22(0,uVar28);
    MStack_1d0._0_4_ = uVar7;
    if (uVar28 == 0) {
      p_Var57 = (_Bool *)0x0;
    }
    else {
      p_Var57 = (pTVar54->external_scanner).states + pTVar54->external_token_count * uVar7;
    }
    pSStack_180 = (&((self_00->stack->heads).contents)->last_external_token)[lStack_138].ptr;
    uStack_1b0 = CONCAT62(uStack_1b0._2_6_,pTVar54->lex_modes[uStack_d0].lex_state);
    bVar62 = (TSStateId)uStack_1f4 == 0;
    uStack_174 = 0;
    uStack_108 = LVar65._0_8_;
    if (pLStack_170->bytes != LVar66.bytes) {
      ts_lexer_goto(&self_00->lexer,LVar66);
    }
    paStack_d8 = &pSStack_180->field_17;
    uStack_e8 = 0;
    uStack_188 = 0;
    uStack_f0 = 0;
    uStack_a0 = 0;
    uStack_bc = 0;
    iStack_19c = 0;
    uStack_190 = 0;
    uStack_f8 = 0;
    do {
      uStack_1c4 = LVar66.extent.column;
      uStack_198 = LVar66._0_8_;
      pLVar37 = &(self_00->lexer).current_position;
      uVar49._0_4_ = pLVar37->bytes;
      uVar49._4_4_ = (pLVar37->extent).row;
      uVar7 = (self_00->lexer).current_position.extent.column;
      LVar65 = *pLVar37;
      if (p_Var57 == (_Bool *)0x0) {
LAB_0012c002:
        TVar30 = (TSStateId)uStack_1b0;
        if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self_00->dot_graph_file != (FILE *)0x0)) {
          snprintf(pcVar60,0x400,"lex_internal state:%d, row:%u, column:%u",uStack_1b0 & 0xffff,
                   uVar49 >> 0x20,(ulong)uVar7);
          ts_parser__log(self_00);
        }
        ts_lexer_start(&self_00->lexer);
        _Var25 = (*self_00->language->lex_fn)((TSLexer *)self_00,TVar30);
        ts_lexer_finish(&self_00->lexer,&uStack_174);
        iVar47 = 2;
        if (!_Var25) {
          if (bVar62) {
            if ((uStack_190 & 1) == 0) {
              if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                 (self_00->dot_graph_file != (FILE *)0x0)) {
                builtin_strncpy(pcVar60,"skip_unrecognized_character",0x1c);
                ts_parser__log(self_00);
              }
              uStack_188._0_4_ = (self_00->lexer).token_start_position.bytes;
              uStack_188._4_4_ = (self_00->lexer).token_start_position.extent.row;
              uStack_bc = (self_00->lexer).token_start_position.extent.column;
              uStack_e8 = (ulong)uStack_bc;
              uStack_f0 = uStack_188 >> 0x20;
              iStack_19c = (self_00->lexer).data.lookahead;
              uStack_190 = CONCAT71((uint7)(uint3)((uint)iStack_19c >> 8),1);
              uStack_a0 = uStack_188;
            }
            if (pLStack_170->bytes == (uint32_t)uStack_188) {
              if ((self_00->lexer).data.lookahead == 0) {
                (self_00->lexer).data.result_symbol = 0xffff;
                goto LAB_0012c1bf;
              }
              (*(self_00->lexer).data.advance)((TSLexer *)self_00,false);
            }
            uStack_188._0_4_ = (self_00->lexer).current_position.bytes;
            uStack_188._4_4_ = (self_00->lexer).current_position.extent.row;
            uStack_f0 = uStack_188 >> 0x20;
            uStack_e8 = (ulong)(self_00->lexer).current_position.extent.column;
            iVar47 = 0;
          }
          else {
            pTVar54 = self_00->language;
            uVar28 = pTVar54->lex_modes->external_lex_state;
            uVar7 = CONCAT22(0,uVar28);
            if (uVar28 == 0) {
              p_Var57 = (_Bool *)0x0;
            }
            else {
              p_Var57 = (pTVar54->external_scanner).states + pTVar54->external_token_count * uVar7;
            }
            uStack_1b0 = CONCAT62(uStack_1b0._2_6_,pTVar54->lex_modes->lex_state);
            bVar62 = true;
            iVar47 = 3;
            MStack_1d0._0_4_ = uVar7;
            if (pLStack_170->bytes != (uint32_t)uStack_198) {
              LVar65.extent.column = uStack_1c4;
              LVar65.bytes = (uint)uStack_198;
              LVar65.extent.row = uStack_198._4_4_;
              ts_lexer_goto(&self_00->lexer,LVar65);
            }
          }
        }
      }
      else {
        if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self_00->dot_graph_file != (FILE *)0x0)) {
          snprintf(pcVar60,0x400,"lex_external state:%d, row:%u, column:%u",
                   (ulong)MStack_1d0.ptr & 0xffff,uVar49 >> 0x20,(ulong)uVar7);
          ts_parser__log(self_00);
        }
        ts_lexer_start(&self_00->lexer);
        if (pSStack_180 == (SubtreeHeapData *)0x0) {
          paVar53 = (anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)0x0;
          uVar3 = 0;
        }
        else {
          uVar3 = (pSStack_180->field_17).external_scanner_state.length;
          paVar53 = paStack_d8;
          if (0x18 < uVar3) {
            paVar53 = (anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)
                      (paStack_d8->field_0).children;
          }
        }
        (*(self_00->language->external_scanner).deserialize)
                  (self_00->external_scanner_payload,(char *)&paVar53->lookahead_char,uVar3);
        _Var25 = (*(self_00->language->external_scanner).scan)
                           (self_00->external_scanner_payload,(TSLexer *)self_00,p_Var57);
        ts_lexer_finish(&self_00->lexer,&uStack_174);
        if (_Var25) {
          iVar47 = 2;
          pLVar37 = pLStack_c8;
          if (pLStack_c8->bytes <= (uint)(undefined4)uVar49) {
            if (!bVar62) {
              _Var25 = ts_stack_has_advanced_since_error(self_00->stack,SVar33);
              pLVar37 = (Length *)CONCAT71(extraout_var,_Var25);
              if (_Var25) goto LAB_0012bfa7;
            }
            goto LAB_0012bfd7;
          }
LAB_0012bfa7:
          bVar63 = false;
          uStack_f8 = CONCAT71((int7)((ulong)pLVar37 >> 8),1);
        }
        else {
LAB_0012bfd7:
          iVar47 = 0;
          bVar63 = true;
          if (pLStack_170->bytes != (undefined4)uVar49) {
            ts_lexer_goto(&self_00->lexer,LVar65);
          }
        }
        if (bVar63) goto LAB_0012c002;
      }
LAB_0012c1bf:
      uVar49 = uStack_108;
      uVar51 = uStack_174;
      pRVar59 = pRStack_1b8;
      LVar66.extent.column = uStack_1c4;
      LVar66.bytes = (uint)uStack_198;
      LVar66.extent.row = uStack_198._4_4_;
    } while (iVar47 != 2);
    uStack_12c = (uint)((ulong)uStack_198 >> 0x20);
    if ((uStack_190 & 1) == 0) {
      if (pLStack_c8->bytes < pLStack_a8->bytes) {
        (pLStack_a8->extent).column = (pLStack_c8->extent).column;
        uVar20 = (pLStack_c8->extent).row;
        pLStack_a8->bytes = pLStack_c8->bytes;
        (pLStack_a8->extent).row = uVar20;
      }
      TVar29 = (self_00->lexer).data.result_symbol;
      pLVar37 = &(self_00->lexer).token_start_position;
      uVar5 = pLVar37->bytes;
      uVar16 = (pLVar37->extent).row;
      uStack_128 = (self_00->lexer).token_start_position.extent.column;
      LStack_1a8.extent = (*pLVar37).extent;
      uVar7 = (*pLVar37).extent;
      if (uStack_12c < uVar7) {
        uVar49 = (ulong)(uVar7 - uStack_12c) | (ulong)LStack_1a8.extent & 0xffffffff00000000;
      }
      else {
        uVar49 = (long)LStack_1a8.extent - ((ulong)uStack_1c4 << 0x20) & 0xffffffff00000000;
      }
      aTStack_160[0].actions._4_4_ = (undefined4)uVar49;
      aTStack_160[0].action_count = (uint32_t)(uVar49 >> 0x20);
      uVar20 = aTStack_160[0].action_count;
      uVar48 = CONCAT44(aTStack_160[0].actions._4_4_,uVar5 - (int)uStack_198);
      pLVar1 = &(self_00->lexer).token_end_position;
      uVar6 = pLVar1->bytes;
      LStack_1a8 = *pLVar1;
      aTStack_160[0].actions._0_4_ = uVar6 - uVar5;
      if ((uint)uVar16 < LStack_1a8.extent.row) {
        uVar49 = (ulong)(LStack_1a8.extent.row - uVar16) |
                 (ulong)LStack_1a8.extent & 0xffffffff00000000;
      }
      else {
        uVar49 = (long)LStack_1a8.extent - ((ulong)uStack_128 << 0x20) & 0xffffffff00000000;
      }
      aTStack_160[0].actions._4_4_ = (undefined4)uVar49;
      aTStack_160[0].action_count = (uint32_t)(uVar49 >> 0x20);
      uVar22 = aTStack_160[0].action_count;
      in_R8 = (char *)CONCAT44(aTStack_160[0].actions._4_4_,(uint32_t)aTStack_160[0].actions);
      uVar2 = (self_00->lexer).token_end_position.bytes;
      uStack_130 = uVar5;
      uStack_12c = uVar16;
      if ((uStack_f8 & 1) == 0) {
        _Var25 = false;
        if ((TVar29 != 0) && (TVar29 == self_00->language->keyword_capture_token)) {
          MStack_1d0._0_4_ = uVar20;
          uStack_1b0 = uVar48;
          if (pLStack_170->bytes != uVar5) {
            ts_lexer_goto(&self_00->lexer,*pLVar37);
          }
          ts_lexer_start(&self_00->lexer);
          _Var25 = false;
          _Var26 = (*self_00->language->keyword_lex_fn)((TSLexer *)self_00,0);
          uVar48 = uStack_1b0;
          if (_Var26) {
            if ((pLStack_c8->bytes == uVar2) &&
               (ts_language_table_entry
                          (self_00->language,(TSStateId)uStack_d0,
                           (self_00->lexer).data.result_symbol,aTStack_160),
               aTStack_160[0].action_count != 0)) {
              TVar29 = (self_00->lexer).data.result_symbol;
              _Var25 = true;
              uVar48 = uStack_1b0;
            }
            else {
              _Var25 = false;
              uVar48 = uStack_1b0;
            }
          }
        }
      }
      else {
        TVar29 = (self_00->language->external_scanner).symbol_map[TVar29];
        _Var25 = false;
      }
      uVar24 = uStack_f8;
      uVar49 = uStack_108;
      padding_01.extent.column = uVar20;
      padding_01.bytes = (int)uVar48;
      padding_01.extent.row = (int)(uVar48 >> 0x20);
      size_01.extent.column = uVar22;
      size_01._0_8_ = in_R8;
      SVar38 = ts_subtree_new_leaf(pSStack_168,TVar29,padding_01,size_01,uVar51 - uVar2,
                                   (TSStateId)uStack_d0,(_Bool)((byte)uStack_f8 & 1),_Var25,
                                   self_00->language);
      pRVar59 = pRStack_1b8;
      if ((uVar24 & 1) != 0) {
        uVar7 = (*(self_00->language->external_scanner).serialize)
                          (self_00->external_scanner_payload,pcVar60);
        ts_external_scanner_state_init
                  (&((SVar38.ptr)->field_17).external_scanner_state,pcVar60,uVar7);
        pRVar59 = pRStack_1b8;
      }
    }
    else {
      LStack_1a8.extent.column = uStack_bc;
      LStack_1a8.bytes = (undefined4)uStack_a0;
      LStack_1a8.extent.row = uStack_a0._4_4_;
      uStack_130 = (uint32_t)uStack_a0;
      uVar7 = (uint)(uStack_a0 >> 0x20);
      if (uStack_12c < uVar7) {
        uVar48 = (ulong)(uVar7 - uStack_12c) | (ulong)LStack_1a8.extent & 0xffffffff00000000;
      }
      else {
        uVar48 = (long)LStack_1a8.extent - ((ulong)uStack_1c4 << 0x20) & 0xffffffff00000000;
      }
      aTStack_160[0].actions._4_4_ = (undefined4)uVar48;
      aTStack_160[0].action_count = (uint32_t)(uVar48 >> 0x20);
      padding.extent.row = aTStack_160[0].actions._4_4_;
      padding.bytes = uStack_130 - (int)uStack_198;
      padding.extent.column = aTStack_160[0].action_count;
      uVar48 = uStack_188 & 0xffffffff | uStack_f0 << 0x20;
      LStack_1a8.extent.column = (uint32_t)uStack_e8;
      LStack_1a8.bytes = (int)uVar48;
      LStack_1a8.extent.row = (int)(uVar48 >> 0x20);
      uStack_128 = uStack_bc;
      aTStack_160[0].actions._0_4_ = (int)uStack_188 - uStack_130;
      if (uVar7 < (uint)uStack_f0) {
        uVar48 = (ulong)((uint)uStack_f0 - uVar7) | (ulong)LStack_1a8.extent & 0xffffffff00000000;
      }
      else {
        uVar48 = (long)LStack_1a8.extent - ((ulong)uStack_bc << 0x20) & 0xffffffff00000000;
      }
      aTStack_160[0].actions._4_4_ = (undefined4)uVar48;
      aTStack_160[0].action_count = (uint32_t)(uVar48 >> 0x20);
      in_R8 = (char *)CONCAT44(aTStack_160[0].actions._4_4_,(uint32_t)aTStack_160[0].actions);
      size.extent.row = aTStack_160[0].actions._4_4_;
      size.bytes = (uint32_t)aTStack_160[0].actions;
      size.extent.column = aTStack_160[0].action_count;
      uStack_12c = uVar7;
      SVar38 = ts_subtree_new_leaf(pSStack_168,0xffff,padding,size,uStack_174 - (int)uStack_188,
                                   (TSStateId)uStack_d0,false,false,self_00->language);
      (SVar38.ptr)->field_0x2c = (SVar38.ptr)->field_0x2c | 0x18;
      ((SVar38.ptr)->field_17).lookahead_char = iStack_19c;
    }
    if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
       (self_00->dot_graph_file != (FILE *)0x0)) {
      if (((ulong)SVar38.ptr & 1) == 0) {
        uVar28 = (SVar38.ptr)->symbol;
      }
      else {
        uVar28 = (ushort)SVar38.data.symbol;
      }
      pcVar44 = "ERROR";
      if (uVar28 != 0xffff) {
        if (uVar28 == 0xfffe) {
          pcVar44 = "_ERROR";
        }
        else {
          pcVar44 = self_00->language->symbol_names[uVar28];
        }
      }
      if (((ulong)SVar38.ptr & 1) == 0) {
        uVar7 = ((Length *)((long)SVar38 + 4))->bytes;
        aTStack_160[0].action_count = ((SVar38.ptr)->padding).extent.column;
      }
      else {
        uVar7 = SVar38._2_4_ & 0xff;
        aTStack_160[0].action_count = SVar38._4_4_ & 0xff;
      }
      if (((ulong)SVar38.ptr & 1) == 0) {
        uVar8 = ((Length *)((long)SVar38 + 0x10))->bytes;
        uVar51 = ((SVar38.ptr)->size).extent.column;
      }
      else {
        uVar51 = SVar38._3_4_ & 0xff;
        uVar8 = uVar51;
      }
      LStack_1a8.extent.column = uVar51;
      in_R8 = (char *)(ulong)(uVar7 + uVar8);
      snprintf(pcVar60,0x400,"lexed_lookahead sym:%s, size:%u",pcVar44);
      ts_parser__log(self_00);
    }
    SStack_1c0 = SVar38;
    ts_parser__set_cached_token(self_00,uVar49 & 0xffffffff,SStack_100,SVar38);
    pTVar54 = self_00->language;
    uVar49 = uStack_d0;
    if (((ulong)SVar38.ptr & 1) == 0) {
      TVar29 = (SVar38.ptr)->symbol;
    }
    else {
      TVar29 = (TSSymbol)SVar38.data.symbol;
    }
LAB_0012c75d:
    ts_language_table_entry(pTVar54,(TSStateId)uVar49,TVar29,&TStack_120);
LAB_0012c76a:
    uStack_190 = CONCAT44(uStack_190._4_4_,uStack_1f4);
LAB_0012c773:
    uVar49 = (ulong)TStack_120.action_count;
    bVar62 = uVar49 != 0;
    if (uVar49 == 0) {
      pSStack_180 = (SubtreeHeapData *)CONCAT44(pSStack_180._4_4_,0xffffffff);
    }
    else {
      lVar61 = CONCAT44(TStack_120.actions._4_4_,(int)TStack_120.actions);
      MStack_1d0.ptr = (SubtreeHeapData *)-uVar49;
      pSStack_180 = (SubtreeHeapData *)CONCAT44(pSStack_180._4_4_,0xffffffff);
      bVar62 = true;
      uVar48 = 1;
      uStack_1b0 = uVar49;
      do {
        bVar50 = *(byte *)(lVar61 + -2 + uVar48 * 8) & 0xf;
        iVar47 = 0;
        if (bVar50 < 4) {
          uVar28 = *(ushort *)(lVar61 + -8 + uVar48 * 8);
          pTVar58 = (TSRangeArray *)(ulong)uVar28;
          uVar42 = *(ushort *)(lVar61 + -6 + uVar48 * 8);
          uVar7 = (uint)(short)uVar42;
          in_R8 = (char *)(ulong)uVar7;
          switch(bVar50) {
          case 0:
            iVar47 = 0;
            if ((uVar7 & 2) == 0) {
              if ((uVar42 & 1) == 0) {
                if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0)
                   || (in_R8 = (char *)pTVar58, self_00->dot_graph_file != (FILE *)0x0)) {
                  snprintf(pcVar60,0x400,"shift state:%u");
LAB_0012ca53:
                  ts_parser__log(self_00);
                  in_R8 = (char *)pTVar58;
                  pRVar59 = pRStack_1b8;
                }
              }
              else {
                if ((TSStateId)uStack_1f4 == 0) {
                  iVar47 = 6;
                  break;
                }
                if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0)
                   || (in_R8 = (char *)(ulong)(TSStateId)uStack_1f4,
                      self_00->dot_graph_file != (FILE *)0x0)) {
                  builtin_strncpy(pcVar60,"shift_extra",0xc);
                  pTVar58 = (TSRangeArray *)(ulong)(TSStateId)uStack_1f4;
                  goto LAB_0012ca53;
                }
              }
              if ((((ulong)SStack_1c0 & 1) == 0) && (*(uint32_t *)((long)SStack_1c0 + 0x24) != 0)) {
                ts_parser__breakdown_lookahead(self_00,&SStack_1c0,(TSStateId)uStack_190,pRVar59);
                if (((ulong)SStack_1c0 & 1) == 0) {
                  uVar28 = *(TSSymbol *)((long)SStack_1c0 + 0x28);
                }
                else {
                  uVar28 = (ushort)SStack_1c0._1_1_;
                }
                if (uVar28 < 0xfffe) {
                  pTVar54 = self_00->language;
                  if ((uint)uVar28 < pTVar54->token_count) {
                    ts_language_table_entry(pTVar54,(TSStateId)uStack_190,uVar28,aTStack_160);
                    if (aTStack_160[0].action_count == 0) {
                      in_R8 = (char *)0x0;
                    }
                    else {
                      in_R8 = (char *)(ulong)*(ushort *)
                                              (CONCAT44(aTStack_160[0].actions._4_4_,
                                                        (uint32_t)aTStack_160[0].actions) +
                                              (ulong)(aTStack_160[0].action_count - 1) * 8);
                      bVar50 = *(byte *)(CONCAT44(aTStack_160[0].actions._4_4_,
                                                  (uint32_t)aTStack_160[0].actions) + 6 +
                                        (ulong)(aTStack_160[0].action_count - 1) * 8);
                      if (((bVar50 & 0xf) != 0) && ((bVar50 & 0xf) != 3)) goto LAB_0012cab7;
                    }
                  }
                  else {
                    in_R8 = (char *)(ulong)pTVar54->parse_table
                                           [pTVar54->symbol_count * (int)uStack_190 + (uint)uVar28];
                  }
                }
                else {
LAB_0012cab7:
                  in_R8 = (char *)0x0;
                }
              }
              if (((ulong)SStack_1c0.ptr & 1) == 0) {
                bVar50 = (byte)(*(uint *)&(SStack_1c0.ptr)->field_0x2c >> 2);
              }
              else {
                bVar50 = (byte)((ulong)SStack_1c0.ptr >> 3);
              }
              SVar38 = SStack_1c0;
              if ((bVar50 & 1) != ((byte)uVar42 & 1)) {
                SVar38 = (Subtree)ts_subtree_make_mut(pSStack_168,SStack_1c0);
                if (((ulong)SVar38.ptr & 1) == 0) {
                  (SVar38.ptr)->field_0x2c = (SVar38.ptr)->field_0x2c | 4;
                }
                else {
                  SVar38.ptr = (SubtreeHeapData *)((ulong)SVar38.ptr | 8);
                }
              }
              if (((ulong)SVar38.ptr & 1) == 0) {
                ts_stack_push(self_00->stack,SVar33,SVar38,(SVar38.ptr)->child_count != 0,
                              (TSStateId)in_R8);
                if (((SVar38.ptr)->field_0x2c & 0x40) != 0) {
                  pSVar55 = self_00->stack;
                  SVar38 = ts_subtree_last_external_token(SVar38);
                  ts_stack_set_last_external_token(pSVar55,SVar33,SVar38);
                }
              }
              else {
                ts_stack_push(self_00->stack,SVar33,SVar38,false,(TSStateId)in_R8);
              }
              goto LAB_0012c8e4;
            }
            break;
          case 1:
            bVar50 = *(byte *)(lVar61 + -4 + uVar48 * 8);
            bVar27 = *(byte *)(lVar61 + -3 + uVar48 * 8);
            if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
               (uVar42 = (ushort)bVar27, self_00->dot_graph_file != (FILE *)0x0)) {
              uStack_188 = CONCAT44(uStack_188._4_4_,(uint)bVar27);
              paStack_d8 = (anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)
                           CONCAT44(paStack_d8._4_4_,uVar7);
              pcVar44 = "ERROR";
              if (uVar28 != 0xffff) {
                if (uVar28 == 0xfffe) {
                  pcVar44 = "_ERROR";
                }
                else {
                  pcVar44 = self_00->language->symbol_names[(long)pTVar58];
                }
              }
              snprintf(pcVar60,0x400,"reduce sym:%s, child_count:%u",pcVar44,(ulong)bVar50);
              ts_parser__log(self_00);
              in_R8 = (char *)((ulong)paStack_d8 & 0xffffffff);
              uVar42 = (uint16_t)uStack_188;
            }
            SVar31 = ts_parser__reduce(self_00,SVar33,uVar28,(uint)bVar50,(int)in_R8,uVar42,
                                       (int)uStack_1b0 != 1);
            SVar43 = (StackVersion)pSStack_180;
            if (SVar31 != 0xffffffff) {
              SVar43 = SVar31;
            }
            pSStack_180 = (SubtreeHeapData *)CONCAT44(pSStack_180._4_4_,SVar43);
            pRVar59 = pRStack_1b8;
            iVar47 = 0;
            break;
          case 2:
            if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
               (self_00->dot_graph_file != (FILE *)0x0)) {
              builtin_strncpy(pcVar60,"accept",7);
              ts_parser__log(self_00);
            }
            ts_parser__accept(self_00,SVar33,SStack_1c0);
            iVar47 = 1;
            break;
          case 3:
            if ((((ulong)SStack_1c0 & 1) == 0) && (*(uint32_t *)((long)SStack_1c0 + 0x24) != 0)) {
              ts_parser__breakdown_lookahead(self_00,&SStack_1c0,0,pRVar59);
            }
            ts_parser__recover(self_00,SVar33,SStack_1c0);
LAB_0012c8e4:
            iVar47 = 1;
            if (MStack_e0.ptr != (SubtreeHeapData *)0x0) {
              reusable_node_advance(pRVar59);
            }
          }
        }
        if ((iVar47 != 6) && (iVar47 != 0)) break;
        bVar62 = uVar48 < uStack_1b0;
        bVar63 = uVar48 != uVar49;
        uVar48 = uVar48 + 1;
      } while (bVar63);
    }
    SVar38 = SStack_1c0;
    if (!bVar62) {
      if ((StackVersion)pSStack_180 != 0xffffffff) goto LAB_0012cd6f;
      if (((ulong)SStack_1c0.ptr & 1) == 0) {
        uVar7 = *(uint *)&(SStack_1c0.ptr)->field_0x2c >> 8;
      }
      else {
        uVar7 = (uint)((ulong)SStack_1c0.ptr >> 6) & 0x3ffffff;
      }
      bVar50 = SStack_1c0.data.symbol;
      if ((uVar7 & 1) != 0) {
        if (((ulong)SStack_1c0.ptr & 1) == 0) {
          TVar29 = (SStack_1c0.ptr)->symbol;
        }
        else {
          TVar29 = (TSSymbol)bVar50;
        }
        symbol = self_00->language->keyword_capture_token;
        if ((TVar29 == symbol) ||
           (ts_language_table_entry(self_00->language,(TSStateId)uStack_190,symbol,&TStack_120),
           TStack_120.action_count == 0)) goto LAB_0012cc7f;
        if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self_00->dot_graph_file != (FILE *)0x0)) {
          if (((ulong)SVar38.ptr & 1) == 0) {
            uVar28 = (SVar38.ptr)->symbol;
          }
          else {
            uVar28 = (ushort)bVar50;
          }
          pTVar54 = self_00->language;
          pcVar44 = "ERROR";
          if (uVar28 != 0xffff) {
            if (uVar28 == 0xfffe) {
              pcVar44 = "_ERROR";
            }
            else {
              pcVar44 = pTVar54->symbol_names[uVar28];
            }
          }
          uVar28 = pTVar54->keyword_capture_token;
          in_R8 = "ERROR";
          if (uVar28 != 0xffff) {
            if (uVar28 == 0xfffe) {
              in_R8 = "_ERROR";
            }
            else {
              in_R8 = pTVar54->symbol_names[uVar28];
            }
          }
          snprintf(pcVar60,0x400,"switch from_keyword:%s, to_word_token:%s",pcVar44);
          ts_parser__log(self_00);
        }
        MVar39 = ts_subtree_make_mut(pSStack_168,SVar38);
        uVar28 = self_00->language->keyword_capture_token;
        if (((ulong)MVar39.ptr & 1) == 0) {
          (MVar39.ptr)->symbol = uVar28;
          SStack_1c0.data = MVar39.data;
        }
        else {
          if (0xfe < uVar28) {
            __assert_fail("symbol < UINT8_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.h"
                          ,0x9f,"void ts_subtree_set_symbol(MutableSubtree *, TSSymbol)");
          }
          SStack_1c0 = (Subtree)((ulong)MVar39.ptr & 0xffffffffffff00ff | (ulong)uVar28 << 8);
        }
        goto LAB_0012c773;
      }
LAB_0012cc7f:
      if ((TSStateId)uStack_1f4 != 0) {
        _Var25 = ts_parser__breakdown_top_of_stack(self_00,SVar33);
        if (!_Var25) {
          if (((self_00->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_00->dot_graph_file != (FILE *)0x0)) {
            builtin_strncpy(pcVar60,"detect_error",0xd);
            ts_parser__log(self_00);
          }
          if (((ulong)SVar38.ptr & 1) == 0) {
            if ((SVar38.ptr)->child_count == 0) {
              TVar29 = (SVar38.ptr)->symbol;
            }
            else {
              TVar29 = ((SVar38.ptr)->field_17).field_0.first_leaf.symbol;
            }
          }
          else {
            TVar29 = (TSSymbol)bVar50;
          }
          ts_stack_pause(self_00->stack,SVar33,TVar29);
          ts_subtree_release(pSStack_168,SVar38);
          goto LAB_0012ce9e;
        }
        goto LAB_0012c773;
      }
      ts_parser__recover(self_00,SVar33,SVar38);
    }
LAB_0012ce9e:
    if (self_00->dot_graph_file != (FILE *)0x0) {
      ts_stack_print_dot_graph(self_00->stack,self_00->language,self_00->dot_graph_file);
      fputs("\n\n",(FILE *)self_00->dot_graph_file);
    }
    LVar65 = ts_stack_position(self_00->stack,SVar33);
    uVar49 = LVar65._0_8_;
    uStack_1b0 = uVar49;
    if ((uStack_c0 < LVar65.bytes) || (uStack_1e0 != 0 && uStack_c0 == LVar65.bytes))
    goto LAB_0012cf09;
    goto LAB_0012b595;
  }
LAB_0012dbc0:
  __assert_fail("(uint32_t)version < (&self->heads)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                ,0x1a0,"Subtree ts_stack_last_external_token(const Stack *, StackVersion)");
}

Assistant:

void ts_stack_clear(Stack *self) {
  stack_node_retain(self->base_node);
  for (uint32_t i = 0; i < self->heads.size; i++) {
    stack_head_delete(&self->heads.contents[i], &self->node_pool, self->subtree_pool);
  }
  array_clear(&self->heads);
  array_push(&self->heads, ((StackHead){
    .node = self->base_node,
    .last_external_token = NULL_SUBTREE,
    .status = StackStatusActive,
    .lookahead_when_paused = 0,
  }));
}